

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O1

int xmlC14NIsNodeInNodeset(void *user_data,xmlNodePtr node,xmlNodePtr parent)

{
  int iVar1;
  xmlNodeSetPtr nodes;
  xmlNodePtr local_38;
  undefined8 uStack_30;
  xmlChar *local_28;
  _xmlNode *p_Stack_20;
  _xmlNode *local_18;
  _xmlNode *p_Stack_10;
  
  iVar1 = 1;
  if (node != (xmlNodePtr)0x0 && user_data != (void *)0x0) {
    if (node->type != XML_NAMESPACE_DECL) {
      iVar1 = xmlXPathNodeSetContains((xmlNodeSetPtr)user_data,node);
      return iVar1;
    }
    uStack_30._0_4_ = node->type;
    uStack_30._4_4_ = *(undefined4 *)&node->field_0xc;
    local_28 = node->name;
    p_Stack_20 = node->children;
    local_18 = node->last;
    p_Stack_10 = node->parent;
    if ((parent != (xmlNodePtr)0x0) && (parent->type == XML_ATTRIBUTE_NODE)) {
      parent = parent->parent;
    }
    local_38 = parent;
    iVar1 = xmlXPathNodeSetContains((xmlNodeSetPtr)user_data,(xmlNodePtr)&stack0xffffffffffffffc8);
  }
  return iVar1;
}

Assistant:

static int
xmlC14NIsNodeInNodeset(void *user_data, xmlNodePtr node, xmlNodePtr parent) {
    xmlNodeSetPtr nodes = (xmlNodeSetPtr) user_data;
    if((nodes != NULL) && (node != NULL)) {
	if(node->type != XML_NAMESPACE_DECL) {
	    return(xmlXPathNodeSetContains(nodes, node));
	} else {
	    xmlNs ns;

	    memcpy(&ns, node, sizeof(ns));

	    /* this is a libxml hack! check xpath.c for details */
	    if((parent != NULL) && (parent->type == XML_ATTRIBUTE_NODE)) {
		ns.next = (xmlNsPtr)parent->parent;
	    } else {
		ns.next = (xmlNsPtr)parent;
	    }

	    /*
	     * If the input is an XPath node-set, then the node-set must explicitly
	     * contain every node to be rendered to the canonical form.
	     */
	    return(xmlXPathNodeSetContains(nodes, (xmlNodePtr)&ns));
	}
    }
    return(1);
}